

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall
AbstractModuleClient::processCommandMsg(AbstractModuleClient *this,string *cmdType,TrodesMsg *msg)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  TrodesMsg *in_RDI;
  uint32_t timestamp;
  string type;
  string src_string;
  int src;
  string file;
  string op;
  int rc;
  string *in_stack_fffffffffffffe18;
  network_pimpl *in_stack_fffffffffffffe20;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  TrodesMsg *in_stack_fffffffffffffed0;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  
  local_1c = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  if (bVar1) {
    (**(code **)(*(long *)&in_RDI->format + 0x68))();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    if (bVar1) {
      TrodesMsg::popstr_abi_cxx11_(in_RDI);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(pcVar3,"_fopen");
      if (iVar2 == 0) {
        TrodesMsg::popstr_abi_cxx11_(in_RDI);
        network_pimpl::setTrodes_filename(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        std::__cxx11::string::string(local_90,local_60);
        (**(code **)(*(long *)&in_RDI->format + 0x48))(in_RDI,local_90);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_60);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcmp(pcVar3,"_fclose");
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b0,"",&local_b1);
          network_pimpl::setTrodes_filename(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          std::__cxx11::string::~string(local_b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_b1);
          (**(code **)(*(long *)&in_RDI->format + 0x50))();
        }
      }
      std::__cxx11::string::~string(local_40);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8,"i",&local_d9);
        TrodesMsg::popcontents<int>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (int *)in_stack_fffffffffffffec0);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        std::__cxx11::string::string(local_100);
        switch(local_b8) {
        case 0:
          std::__cxx11::string::operator=(local_100,"None");
          break;
        case 1:
          std::__cxx11::string::operator=(local_100,"Generator");
          break;
        case 2:
          std::__cxx11::string::operator=(local_100,"Spikes Generator");
          break;
        case 3:
          std::__cxx11::string::operator=(local_100,"File");
          break;
        case 4:
          std::__cxx11::string::operator=(local_100,"Ethernet");
          break;
        case 5:
          std::__cxx11::string::operator=(local_100,"USB");
          break;
        case 6:
          std::__cxx11::string::operator=(local_100,"Rhythm");
        }
        std::__cxx11::string::string(local_120,local_100);
        (**(code **)(*(long *)&in_RDI->format + 0x60))(in_RDI,local_120);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_100);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
        if (bVar1) {
          std::__cxx11::string::string((string *)&stack0xfffffffffffffec0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_168,"s4",&local_169);
          TrodesMsg::popcontents<std::__cxx11::string,unsigned_int>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     (uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
          std::__cxx11::string::string(local_190,(string *)&stack0xfffffffffffffec0);
          (**(code **)(*(long *)&in_RDI->format + 0x58))(in_RDI,local_190,in_stack_fffffffffffffebc)
          ;
          std::__cxx11::string::~string(local_190);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
        }
      }
    }
  }
  return local_1c;
}

Assistant:

int AbstractModuleClient::processCommandMsg(std::string cmdType, TrodesMsg &msg) {
    int rc = 0;
    if (cmdType == quit_CMD) {
        // std::cout << "Client " << id << " got quit command.\n";
        recv_quit();
    }
    else if(cmdType == file_CMD){
        //Call user defined file commands
        std::string op = msg.popstr();
        if(streq(op.c_str(), file_OPEN)){
            std::string file = msg.popstr();
            state->setTrodes_filename(file);
            recv_file_open(file);
        }
        else if(streq(op.c_str(), file_CLOSE)){
            state->setTrodes_filename("");
            recv_file_close();
        }
    }
    else if(cmdType == source_CMD){
        int src;
        msg.popcontents("i", src);
        std::string src_string;
        switch (src) {
        case None:
            src_string = "None";
            break;
        case Fake:
            src_string = "Generator";
            break;
        case FakeSpikes:
            src_string = "Spikes Generator";
            break;
        case File:
            src_string = "File";
            break;
        case Ethernet:
            src_string = "Ethernet";
            break;
        case USBDAQ:
            src_string = "USB";
            break;
        case Rhythm:
            src_string = "Rhythm";
            break;
        default:
            break;
        }
        // std::cerr << "got source " << src_string << "\n";
        recv_source(src_string);
    }
    else if(cmdType == acquisition_CMD){
        std::string type;
        uint32_t timestamp;
        msg.popcontents("s4",type,timestamp);
        recv_acquisition(type, timestamp);
    }
    // else{
    //     std::cout << "[AMC]: Trodes Command [" << cmdType << "] not recognized.\n";
    // }
    return rc;
}